

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O1

unique_ptr<ProjectGroup,_std::default_delete<ProjectGroup>_> parseProject(Output *output,char *file)

{
  char *base;
  long *plVar1;
  long *plVar2;
  char *in_RDX;
  uint line;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Regex>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Regex>_>_>_>
  regexCache;
  string pathBase;
  ifstream in;
  allocator local_2c9;
  long *local_2c8;
  long local_2c0;
  long local_2b8;
  long lStack_2b0;
  char *local_2a8;
  _Rb_tree_node_base local_2a0;
  size_t local_280;
  undefined1 *local_278 [2];
  undefined1 local_268 [16];
  string local_258;
  long local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream(local_238,in_RDX,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
    getCurrentDirectory_abi_cxx11_();
    base = local_2a8;
    std::__cxx11::string::string((string *)local_278,in_RDX,&local_2c9);
    plVar1 = (long *)std::__cxx11::string::append((char *)local_278);
    plVar2 = plVar1 + 2;
    if ((long *)*plVar1 == plVar2) {
      local_2b8 = *plVar2;
      lStack_2b0 = plVar1[3];
      local_2c8 = &local_2b8;
    }
    else {
      local_2b8 = *plVar2;
      local_2c8 = (long *)*plVar1;
    }
    local_2c0 = plVar1[1];
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    normalizePath_abi_cxx11_(&local_258,base,(char *)local_2c8);
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8);
    }
    if (local_278[0] != local_268) {
      operator_delete(local_278[0]);
    }
    if ((_Base_ptr *)local_2a8 != &local_2a0._M_parent) {
      operator_delete(local_2a8);
    }
    local_2c8 = (long *)((ulong)local_2c8 & 0xffffffff00000000);
    local_2a0._M_left = &local_2a0;
    local_2a0._M_color = _S_red;
    local_2a0._M_parent = (_Base_ptr)0x0;
    local_280 = 0;
    local_2a0._M_right = local_2a0._M_left;
    parseGroup((ifstream *)output,(char *)local_238,(uint *)&local_2c8,(ProjectGroup *)0x0,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Regex>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Regex>_>_>_>
                *)&local_2a8,local_258._M_dataplus._M_p);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Regex>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Regex>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Regex>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Regex>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Regex>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Regex>_>_>_>
                 *)&local_2a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p);
    }
  }
  else {
    (**(code **)(*(long *)file + 0x20))(file,"Error reading file %s\n");
    output->_vptr_Output = (_func_int **)0x0;
  }
  std::ifstream::~ifstream(local_238);
  return (__uniq_ptr_data<ProjectGroup,_std::default_delete<ProjectGroup>,_true,_true>)
         (__uniq_ptr_data<ProjectGroup,_std::default_delete<ProjectGroup>,_true,_true>)output;
}

Assistant:

std::unique_ptr<ProjectGroup> parseProject(Output* output, const char* file)
{
	std::ifstream in(file);
	if (!in)
	{
		output->error("Error reading file %s\n", file);
		return std::unique_ptr<ProjectGroup>();
	}

	// treat all project paths as project file-relative; treat project file path as current directory-relative
	std::string pathBase = normalizePath(getCurrentDirectory().c_str(), (std::string(file) + "/..").c_str());

	unsigned int line = 0;
	std::map<std::string, std::shared_ptr<Regex>> regexCache;

	try
	{
		return parseGroup(in, file, line, 0, regexCache, pathBase.c_str());
	}
	catch (const std::exception& e)
	{
		output->error("%s(%d): %s\n", file, line, e.what());
		return std::unique_ptr<ProjectGroup>();
	}
}